

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

ExpandDimsLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::ExpandDimsLayerParams>
          (Arena *arena)

{
  ExpandDimsLayerParams *pEVar1;
  
  if (arena != (Arena *)0x0) {
    pEVar1 = DoCreateMessage<CoreML::Specification::ExpandDimsLayerParams>(arena);
    return pEVar1;
  }
  pEVar1 = (ExpandDimsLayerParams *)operator_new(0x28);
  CoreML::Specification::ExpandDimsLayerParams::ExpandDimsLayerParams(pEVar1,(Arena *)0x0,false);
  return pEVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }